

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O2

void __thiscall adios2::utils::Reorganize::Reorganize(Reorganize *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int i;
  pointer pbVar6;
  ulong uVar7;
  Reorganize *pRVar8;
  pointer pbVar9;
  int prod;
  allocator local_179;
  Reorganize *local_178;
  string errmsg;
  Comm commWorld;
  string local_120;
  string local_100;
  string *local_e0;
  string *local_d8;
  string *local_d0;
  string *local_c8;
  long local_c0;
  char **local_b8;
  char *end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [56];
  string local_50;
  
  std::__cxx11::string::string((string *)(local_88 + 0x38),"adios_reorganize",(allocator *)&errmsg);
  Utils::Utils(&this->super_Utils,(string *)(local_88 + 0x38),argc,argv);
  std::__cxx11::string::~string((string *)(local_88 + 0x38));
  (this->super_Utils)._vptr_Utils = (_func_int **)&PTR__Reorganize_00115ce8;
  (this->m_FileName)._M_dataplus._M_p = (pointer)&(this->m_FileName).field_2;
  (this->m_FileName)._M_string_length = 0;
  (this->m_FileName).field_2._M_local_buf[0] = '\0';
  (this->infilename)._M_dataplus._M_p = (pointer)&(this->infilename).field_2;
  (this->infilename)._M_string_length = 0;
  (this->infilename).field_2._M_local_buf[0] = '\0';
  (this->outfilename)._M_dataplus._M_p = (pointer)&(this->outfilename).field_2;
  (this->outfilename)._M_string_length = 0;
  (this->outfilename).field_2._M_local_buf[0] = '\0';
  (this->wmethodname)._M_dataplus._M_p = (pointer)&(this->wmethodname).field_2;
  (this->wmethodname)._M_string_length = 0;
  (this->wmethodname).field_2._M_local_buf[0] = '\0';
  (this->wmethodparam_str)._M_dataplus._M_p = (pointer)&(this->wmethodparam_str).field_2;
  (this->wmethodparam_str)._M_string_length = 0;
  local_d8 = (string *)&this->wmethodname;
  local_e0 = (string *)&this->wmethodparam_str;
  (this->wmethodparam_str).field_2._M_local_buf[0] = '\0';
  (this->rmethodname)._M_dataplus._M_p = (pointer)&(this->rmethodname).field_2;
  (this->rmethodname)._M_string_length = 0;
  local_c8 = (string *)&this->rmethodname;
  (this->rmethodname).field_2._M_local_buf[0] = '\0';
  local_d0 = (string *)&this->rmethodparam_str;
  (this->rmethodparam_str)._M_dataplus._M_p = (pointer)&(this->rmethodparam_str).field_2;
  (this->rmethodparam_str)._M_string_length = 0;
  (this->rmethodparam_str).field_2._M_local_buf[0] = '\0';
  this->m_Rank = 0;
  this->m_Size = 1;
  pRVar8 = (Reorganize *)&this->m_Comm;
  adios2::helper::Comm::Comm((Comm *)pRVar8);
  p_Var1 = &(this->rmethodparams)._M_t._M_impl.super__Rb_tree_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->wmethodparams)._M_t._M_impl.super__Rb_tree_header;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->largest_block = 0;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->write_total = 0;
  this->handleAsStream = true;
  this->decomp_values[0] = 1;
  this->decomp_values[1] = 1;
  this->decomp_values[2] = 1;
  this->decomp_values[3] = 1;
  this->decomp_values[4] = 1;
  this->decomp_values[5] = 1;
  this->decomp_values[6] = 1;
  this->decomp_values[7] = 1;
  this->decomp_values[8] = 1;
  this->decomp_values[9] = 1;
  local_88._32_8_ = pRVar8;
  adios2::helper::CommWithMPI((ompi_communicator_t *)&commWorld);
  errmsg._M_dataplus._M_p = (pointer)&errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  adios2::helper::Comm::Split((int)&local_120,(int)&commWorld,(string *)0x5cb3);
  adios2::helper::Comm::operator=((Comm *)pRVar8,(Comm *)&local_120);
  adios2::helper::Comm::~Comm((Comm *)&local_120);
  std::__cxx11::string::~string((string *)&errmsg);
  adios2::helper::Comm::~Comm(&commWorld);
  iVar3 = adios2::helper::Comm::Rank();
  this->m_Rank = iVar3;
  iVar3 = adios2::helper::Comm::Size();
  local_88._40_8_ = &this->m_Size;
  *(int *)local_88._40_8_ = iVar3;
  if (argc < 7) {
    PrintUsage(pRVar8);
    std::__cxx11::string::string((string *)&errmsg,"Utils",(allocator *)local_88);
    std::__cxx11::string::string((string *)&commWorld,"AdiosReorganize",(allocator *)&local_a8);
    std::__cxx11::string::string((string *)&local_120,"Reorganize",(allocator *)&end);
    std::__cxx11::string::string
              ((string *)&local_100,"Not enough arguments. At least 6 are required",
               (allocator *)&prod);
    helper::Throw<std::invalid_argument>(&errmsg,(string *)&commWorld,&local_120,&local_100,-1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&commWorld);
    std::__cxx11::string::~string((string *)&errmsg);
  }
  std::__cxx11::string::string((string *)&errmsg,argv[1],(allocator *)&commWorld);
  std::__cxx11::string::operator=((string *)&this->infilename,(string *)&errmsg);
  std::__cxx11::string::~string((string *)&errmsg);
  std::__cxx11::string::string((string *)&errmsg,argv[2],(allocator *)&commWorld);
  std::__cxx11::string::operator=((string *)&this->outfilename,(string *)&errmsg);
  std::__cxx11::string::~string((string *)&errmsg);
  std::__cxx11::string::string((string *)&errmsg,argv[3],(allocator *)&commWorld);
  std::__cxx11::string::operator=(local_c8,(string *)&errmsg);
  std::__cxx11::string::~string((string *)&errmsg);
  std::__cxx11::string::string((string *)&errmsg,argv[4],(allocator *)&commWorld);
  std::__cxx11::string::operator=(local_d0,(string *)&errmsg);
  std::__cxx11::string::~string((string *)&errmsg);
  std::__cxx11::string::string((string *)&errmsg,argv[5],(allocator *)&commWorld);
  local_178 = this;
  std::__cxx11::string::operator=(local_d8,(string *)&errmsg);
  std::__cxx11::string::~string((string *)&errmsg);
  local_b8 = argv;
  std::__cxx11::string::string((string *)&errmsg,argv[6],(allocator *)&commWorld);
  std::__cxx11::string::operator=(local_e0,(string *)&errmsg);
  std::__cxx11::string::~string((string *)&errmsg);
  local_c0 = (long)argc;
  pbVar9 = (pointer)0x0;
  for (uVar7 = 7; (pRVar8 = local_178, (long)uVar7 < local_c0 && (uVar7 < 0xd)); uVar7 = uVar7 + 1)
  {
    piVar4 = __errno_location();
    *piVar4 = 0;
    lVar5 = strtol(local_b8[uVar7],&end,10);
    local_178->decomp_values[(long)pbVar9] = (int)lVar5;
    local_88._48_8_ = pbVar9;
    if ((*piVar4 != 0) || ((end != (char *)0x0 && (*end != '\0')))) {
      std::__cxx11::to_string((string *)local_88,(int)uVar7);
      std::operator+(&local_100,"ERROR: Invalid decomposition number in argument ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+(&local_120,&local_100,": \'");
      std::__cxx11::string::string((string *)&local_a8,local_b8[uVar7],(allocator *)&prod);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commWorld
                     ,&local_120,&local_a8);
      std::operator+(&errmsg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &commWorld,"\'\n");
      std::__cxx11::string::~string((string *)&commWorld);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      pRVar8 = (Reorganize *)local_88;
      std::__cxx11::string::~string((string *)local_88);
      PrintUsage(pRVar8);
      std::__cxx11::string::string((string *)&commWorld,"Utils",(allocator *)local_88);
      std::__cxx11::string::string((string *)&local_120,"AdiosReorganize",(allocator *)&local_a8);
      std::__cxx11::string::string((string *)&local_100,"Reorganize",(allocator *)&prod);
      helper::Throw<std::invalid_argument>((string *)&commWorld,&local_120,&local_100,&errmsg,-1);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&commWorld);
      std::__cxx11::string::~string((string *)&errmsg);
    }
    pbVar9 = (pointer)((long)&((_Alloc_hider *)local_88._48_8_)->_M_p + 1);
  }
  if ((long)uVar7 < local_c0) {
    std::__cxx11::string::string((string *)&errmsg,"Utils",(allocator *)local_88);
    std::__cxx11::string::string((string *)&commWorld,"AdiosReorganize",(allocator *)&local_a8);
    std::__cxx11::string::string((string *)&local_120,"Reorganize",(allocator *)&prod);
    std::__cxx11::string::string
              ((string *)&local_100,"Up to 6 decomposition arguments are supported",&local_179);
    helper::Throw<std::invalid_argument>(&errmsg,(string *)&commWorld,&local_120,&local_100,-1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&commWorld);
    std::__cxx11::string::~string((string *)&errmsg);
  }
  uVar2 = local_88._40_8_;
  prod = 1;
  for (pbVar6 = (pointer)0x0; pbVar9 != pbVar6;
      pbVar6 = (pointer)((long)&(pbVar6->_M_dataplus)._M_p + 1)) {
    prod = prod * pRVar8->decomp_values[(long)pbVar6];
  }
  if (*(int *)&((_Alloc_hider *)local_88._40_8_)->_M_p < prod) {
    print0<char_const(&)[69],int&,int&>
              (pRVar8,(char (*) [69])
                      "ERROR: Product of decomposition numbers %d > number of processes %d\n",&prod,
               (int *)local_88._40_8_);
    std::__cxx11::to_string((string *)local_88,prod);
    std::operator+(&local_100,"ERROR: The product of decomposition numbers ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::operator+(&local_120,&local_100," > number of processes ");
    std::__cxx11::to_string(&local_a8,*(int *)&((_Alloc_hider *)uVar2)->_M_p);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commWorld,
                   &local_120,&local_a8);
    std::operator+(&errmsg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &commWorld,"\n");
    std::__cxx11::string::~string((string *)&commWorld);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    pRVar8 = (Reorganize *)local_88;
    std::__cxx11::string::~string((string *)pRVar8);
    PrintUsage(pRVar8);
    std::__cxx11::string::string((string *)&commWorld,"Utils",(allocator *)local_88);
    std::__cxx11::string::string((string *)&local_120,"AdiosReorganize",(allocator *)&local_a8);
    std::__cxx11::string::string((string *)&local_100,"Reorganize",&local_179);
    helper::Throw<std::invalid_argument>((string *)&commWorld,&local_120,&local_100,&errmsg,-1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&commWorld);
    std::__cxx11::string::~string((string *)&errmsg);
  }
  return;
}

Assistant:

Reorganize::Reorganize(int argc, char *argv[]) : Utils("adios_reorganize", argc, argv)
{
#if ADIOS2_USE_MPI
    {
        auto commWorld = helper::CommWithMPI(MPI_COMM_WORLD);
        m_Comm = commWorld.Split(m_CommSplitColor, 0);
    }
#else
    m_Comm = helper::CommDummy();
#endif
    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();

    if (argc < 7)
    {
        PrintUsage();
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize",
                                             "Not enough arguments. At least 6 are required");
    }
    infilename = std::string(argv[1]);
    outfilename = std::string(argv[2]);
    rmethodname = std::string(argv[3]);
    rmethodparam_str = std::string(argv[4]);
    wmethodname = std::string(argv[5]);
    wmethodparam_str = std::string(argv[6]);

    int nd = 0;
    int j = 7;
    char *end;
    while (argc > j && j < 13)
    { // get max 6 dimensions
        errno = 0;
        decomp_values[nd] = std::strtol(argv[j], &end, 10);
        if (errno || (end != 0 && *end != '\0'))
        {
            std::string errmsg("ERROR: Invalid decomposition number in argument " +
                               std::to_string(j) + ": '" + std::string(argv[j]) + "'\n");
            PrintUsage();
            helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize", errmsg);
        }
        nd++;
        j++;
    }

    if (argc > j)
    {
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize",
                                             "Up to 6 decomposition arguments are supported");
    }

    int prod = 1;
    for (int i = 0; i < nd; i++)
    {
        prod *= decomp_values[i];
    }

    if (prod > m_Size)
    {
        print0("ERROR: Product of decomposition numbers %d > number of "
               "processes %d\n",
               prod, m_Size);
        std::string errmsg("ERROR: The product of decomposition numbers " + std::to_string(prod) +
                           " > number of processes " + std::to_string(m_Size) + "\n");
        PrintUsage();
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize", errmsg);
    }
}